

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O2

LCC_API_CLOUD_PROVIDER __thiscall
license::os::ExecutionEnvironment::cloud_provider(ExecutionEnvironment *this)

{
  long lVar1;
  LCC_API_CLOUD_PROVIDER LVar2;
  string bios_description;
  string sys_vendor;
  string bios_vendor;
  
  std::__cxx11::string::string
            ((string *)&bios_description,(string *)&(this->m_dmi_info).m_bios_description);
  std::__cxx11::string::string((string *)&bios_vendor,(string *)&(this->m_dmi_info).m_bios_vendor);
  std::__cxx11::string::string((string *)&sys_vendor,(string *)&(this->m_dmi_info).m_sys_vendor);
  if (((bios_description._M_string_length != 0) || (bios_vendor._M_string_length != 0)) ||
     (LVar2 = PROV_UNKNOWN, sys_vendor._M_string_length != 0)) {
    lVar1 = std::__cxx11::string::find((char *)&bios_vendor,0x19962a);
    LVar2 = ALI_CLOUD;
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)&bios_description,0x199632);
      if (lVar1 == -1) {
        lVar1 = std::__cxx11::string::find((char *)&sys_vendor,0x199632);
        if (lVar1 == -1) {
          lVar1 = std::__cxx11::string::find((char *)&sys_vendor,0x19963a);
          LVar2 = GOOGLE_CLOUD;
          if (lVar1 == -1) {
            lVar1 = std::__cxx11::string::find((char *)&bios_description,0x199641);
            if (lVar1 == -1) {
              lVar1 = std::__cxx11::string::find((char *)&bios_vendor,0x199655);
              LVar2 = AWS;
              if (lVar1 == -1) {
                lVar1 = std::__cxx11::string::find((char *)&bios_description,0x199659);
                if (lVar1 == -1) {
                  lVar1 = std::__cxx11::string::find((char *)&sys_vendor,0x199655);
                  if (lVar1 == -1) {
                    lVar1 = std::__cxx11::string::find((char *)&bios_description,0x199660);
                    if (lVar1 == -1) {
                      LVar2 = PROV_UNKNOWN;
                      lVar1 = std::__cxx11::string::find((char *)&bios_description,0x19966a);
                      if (lVar1 == -1) {
                        lVar1 = std::__cxx11::string::find((char *)&bios_description,0x19966f);
                        if (lVar1 == -1) goto LAB_0011d01f;
                      }
                    }
                    LVar2 = ON_PREMISE;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011d01f:
  std::__cxx11::string::~string((string *)&sys_vendor);
  std::__cxx11::string::~string((string *)&bios_vendor);
  std::__cxx11::string::~string((string *)&bios_description);
  return LVar2;
}

Assistant:

LCC_API_CLOUD_PROVIDER ExecutionEnvironment::cloud_provider() const {
	LCC_API_CLOUD_PROVIDER result = PROV_UNKNOWN;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if (bios_description.size() > 0 || bios_vendor.size() > 0 || sys_vendor.size() > 0) {
		if (bios_vendor.find("SEABIOS") != string::npos || bios_description.find("ALIBABA") != string::npos ||
			sys_vendor.find("ALIBABA") != string::npos) {
			result = ALI_CLOUD;
		} else if (sys_vendor.find("GOOGLE") != string::npos ||
				   bios_description.find("GOOGLECOMPUTEENGINE") != string::npos) {
			result = GOOGLE_CLOUD;
		} else if (bios_vendor.find("AWS") != string::npos || bios_description.find("AMAZON") != string::npos ||
				   sys_vendor.find("AWS") != string::npos) {
			result = AWS;
		} else if (bios_description.find("HP-COMPAQ") != string::npos ||
				   bios_description.find("ASUS") != string::npos || bios_description.find("DELL") != string::npos) {
			result = ON_PREMISE;
		}
	}
	return result;
}